

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_impl.hpp
# Opt level: O0

void __thiscall lightconf::value::value(value *this,string *str)

{
  string *str_local;
  value *this_local;
  
  this->type_ = string_type;
  std::__cxx11::string::string((string *)&this->string_value_,(string *)str);
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::vector(&this->vector_value_);
  group::group(&this->group_value_);
  return;
}

Assistant:

inline value::value(const std::string& str)     : type_(value_type::string_type), string_value_(str) { }